

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satUtil.c
# Opt level: O2

void Sat_SolverClauseWriteDimacs(FILE *pFile,clause *pC,int fIncrement)

{
  char *pcVar1;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < (uint)*pC >> 0xb; uVar2 = uVar2 + 1) {
    pcVar1 = "-";
    if (((uint)pC[uVar2 + 1] & 1) == 0) {
      pcVar1 = "";
    }
    fprintf((FILE *)pFile,"%s%d ",pcVar1,(ulong)(((int)pC[uVar2 + 1] >> 1) + (uint)(0 < fIncrement))
           );
  }
  if (fIncrement != 0) {
    fputc(0x30,(FILE *)pFile);
  }
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Sat_SolverClauseWriteDimacs( FILE * pFile, clause * pC, int fIncrement )
{
    int i;
    for ( i = 0; i < (int)pC->size; i++ )
        fprintf( pFile, "%s%d ", (lit_sign(pC->lits[i])? "-": ""),  lit_var(pC->lits[i]) + (fIncrement>0) );
    if ( fIncrement )
        fprintf( pFile, "0" );
    fprintf( pFile, "\n" );
}